

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.h
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::~InterfaceVariableScalarReplacement
          (InterfaceVariableScalarReplacement *this)

{
  MessageConsumer *pMVar1;
  _Manager_type p_Var2;
  
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__InterfaceVariableScalarReplacement_00938c40;
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->vars_without_extra_arrayness)._M_h);
  std::
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->vars_with_extra_arrayness)._M_h);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->composite_ids_to_component_depths)._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->interface_vars_removed_from_entry_point_operands_)._M_h);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__Pass_00930b38;
  p_Var2 = (this->super_Pass).consumer_.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pMVar1 = &(this->super_Pass).consumer_;
    (*p_Var2)((_Any_data *)pMVar1,(_Any_data *)pMVar1,__destroy_functor);
  }
  operator_delete(this,0x118);
  return;
}

Assistant:

InterfaceVariableScalarReplacement() {}